

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

int __thiscall TURBOLINECOUNT::CLineCount::close(CLineCount *this,int __fd)

{
  int iVar1;
  int *piVar2;
  char *__s;
  int iVar3;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  string *ctx;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  
  ctx = (string *)CONCAT44(in_register_00000034,__fd);
  if (this->m_opened == false) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,"file not opened",&local_59);
    this->m_lasterror = 9;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    std::__cxx11::string::~string(local_38);
    iVar3 = 0;
  }
  else {
    iVar1 = ::close(this->m_fh);
    iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 != -1);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      __s = strerror(iVar1);
      std::__cxx11::string::string<std::allocator<char>>(local_58,__s,&local_59);
      this->m_lasterror = iVar1;
      ctx = local_58;
      std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
      std::__cxx11::string::~string(local_58);
    }
    init(this,(EVP_PKEY_CTX *)ctx);
  }
  return iVar3;
}

Assistant:

bool CLineCount::close()
{
	if (!m_opened)
	{
		setLastError(EBADF, _T("file not opened"));
		return false;
	}

	bool ok = true;
	if (!LCCLOSEFILE(m_fh))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to close file"));
		ok = false;
	}

	init();

	return ok;
}